

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

void __thiscall FLispString::AddFloat(FLispString *this,double f,bool single)

{
  int iVar1;
  size_t len;
  undefined7 in_register_00000031;
  char buf [32];
  char acStack_38 [40];
  
  iVar1 = mysnprintf(acStack_38,0x20,"%.4f");
  len = (size_t)iVar1;
  if ((int)CONCAT71(in_register_00000031,single) != 0) {
    (acStack_38 + len)[0] = 'f';
    (acStack_38 + len)[1] = '\0';
    len = len + 1;
  }
  Add(this,acStack_38,len);
  return;
}

Assistant:

void AddFloat(double f, bool single)
	{
		char buf[32];
		size_t len = mysnprintf(buf, countof(buf), "%.4f", f);
		if (single)
		{
			buf[len++] = 'f';
			buf[len] = '\0';
		}
		Add(buf, len);
	}